

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetresizehandler.cpp
# Opt level: O1

void __thiscall QWidgetResizeHandler::keyPressEvent(QWidgetResizeHandler *this,QKeyEvent *e)

{
  QWidget *this_00;
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  ulong uVar4;
  int extraout_var;
  int extraout_EDX;
  int extraout_var_00;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QCursor QStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((byte)this[0x40] & 2) == 0) || (*(int *)(this + 0x30) == 9)) goto switchD_00475cbe_default;
  uVar1 = QKeyEvent::modifiers();
  iVar5 = 1;
  if ((uVar1 >> 0x1a & 1) == 0) {
    iVar5 = 8;
  }
  uVar4 = QCursor::pos();
  uVar1 = (uint)uVar4;
  iVar6 = (int)(uVar4 >> 0x20);
  iVar2 = *(int *)(e + 0x40);
  if (iVar2 < 0x1000012) {
    if (((1 < iVar2 + 0xfefffffcU) && (iVar2 != 0x20)) && (iVar2 != 0x1000000))
    goto switchD_00475cbe_default;
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfd);
    QWidget::releaseMouse(*(QWidget **)(this + 0x10));
    QWidget::releaseKeyboard(*(QWidget **)(this + 0x10));
    this[0x40] = (QWidgetResizeHandler)((byte)this[0x40] & 0xfe);
  }
  else {
    switch(iVar2) {
    case 0x1000012:
      uVar1 = uVar1 - iVar5;
      uVar4 = (ulong)uVar1;
      QGuiApplication::primaryScreen();
      iVar2 = QScreen::virtualGeometry();
      if ((int)uVar1 <= iVar2) {
        if ((*(uint *)(this + 0x30) | 2) == 3) {
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + iVar5;
          *(int *)(this + 0x28) = *(int *)(this + 0x28) + iVar5;
        }
        else {
          *(int *)(this + 0x20) = *(int *)(this + 0x20) - iVar5;
          *(int *)(this + 0x28) = *(int *)(this + 0x28) - iVar5;
        }
      }
      iVar5 = *(int *)(this + 0x30);
      if (((iVar5 != 9 & (byte)this[0x40] >> 1) == 1) && (resizeHorizontalDirectionFixed == '\0')) {
        resizeHorizontalDirectionFixed = '\x01';
        if (iVar5 == 2) {
LAB_00475e40:
          uVar3 = 3;
          goto LAB_00475ee1;
        }
        if (iVar5 == 4) goto LAB_00475edc;
LAB_00475ee5:
        uVar1 = (uint)uVar4;
        setMouseCursor(this,*(MousePosition *)(this + 0x30));
        this_00 = *(QWidget **)(this + 0x10);
        QWidget::cursor((QWidget *)&QStack_38);
        QWidget::grabMouse(this_00,&QStack_38);
        QCursor::~QCursor(&QStack_38);
      }
      break;
    case 0x1000013:
      iVar6 = iVar6 - iVar5;
      QGuiApplication::primaryScreen();
      QScreen::virtualGeometry();
      if (iVar6 <= extraout_var) {
        if ((*(int *)(this + 0x30) == 4) || (*(int *)(this + 0x30) == 1)) {
          *(int *)(this + 0x24) = *(int *)(this + 0x24) + iVar5;
          *(int *)(this + 0x2c) = *(int *)(this + 0x2c) + iVar5;
        }
        else {
          *(int *)(this + 0x24) = *(int *)(this + 0x24) - iVar5;
          *(int *)(this + 0x2c) = *(int *)(this + 0x2c) - iVar5;
        }
      }
      iVar5 = *(int *)(this + 0x30);
      if (((iVar5 != 9 & (byte)this[0x40] >> 1) == 1) && (resizeVerticalDirectionFixed == '\0')) {
        resizeVerticalDirectionFixed = '\x01';
        if (iVar5 == 3) {
LAB_00475edc:
          uVar3 = 1;
        }
        else {
          if (iVar5 != 2) goto LAB_00475ee5;
LAB_00475ed5:
          uVar3 = 4;
        }
LAB_00475ee1:
        *(undefined4 *)(this + 0x30) = uVar3;
        goto LAB_00475ee5;
      }
      break;
    case 0x1000014:
      uVar1 = uVar1 + iVar5;
      uVar4 = (ulong)uVar1;
      QGuiApplication::primaryScreen();
      QScreen::virtualGeometry();
      if (extraout_EDX <= (int)uVar1) {
        if ((*(int *)(this + 0x30) == 4) || (*(int *)(this + 0x30) == 2)) {
          *(int *)(this + 0x20) = *(int *)(this + 0x20) + iVar5;
          *(int *)(this + 0x28) = *(int *)(this + 0x28) + iVar5;
        }
        else {
          *(int *)(this + 0x20) = *(int *)(this + 0x20) - iVar5;
          *(int *)(this + 0x28) = *(int *)(this + 0x28) - iVar5;
        }
      }
      iVar5 = *(int *)(this + 0x30);
      if (((iVar5 != 9 & (byte)this[0x40] >> 1) == 1) && (resizeHorizontalDirectionFixed == '\0')) {
        resizeHorizontalDirectionFixed = '\x01';
        if (iVar5 == 3) {
LAB_00475e8d:
          uVar3 = 2;
          goto LAB_00475ee1;
        }
        if (iVar5 == 1) goto LAB_00475ed5;
        goto LAB_00475ee5;
      }
      break;
    case 0x1000015:
      iVar6 = iVar6 + iVar5;
      QGuiApplication::primaryScreen();
      QScreen::virtualGeometry();
      if (extraout_var_00 <= iVar6) {
        if ((*(uint *)(this + 0x30) & 0xfffffffe) == 2) {
          *(int *)(this + 0x24) = *(int *)(this + 0x24) + iVar5;
          iVar5 = iVar5 + *(int *)(this + 0x2c);
        }
        else {
          *(int *)(this + 0x24) = *(int *)(this + 0x24) - iVar5;
          iVar5 = *(int *)(this + 0x2c) - iVar5;
        }
        *(int *)(this + 0x2c) = iVar5;
      }
      iVar5 = *(int *)(this + 0x30);
      if (((iVar5 != 9 & (byte)this[0x40] >> 1) == 1) && (resizeVerticalDirectionFixed == '\0')) {
        resizeVerticalDirectionFixed = '\x01';
        if (iVar5 == 1) goto LAB_00475e40;
        if (iVar5 == 4) goto LAB_00475e8d;
        goto LAB_00475ee5;
      }
      break;
    default:
      goto switchD_00475cbe_default;
    }
  }
  QCursor::setPos(uVar1,iVar6);
switchD_00475cbe_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetResizeHandler::keyPressEvent(QKeyEvent * e)
{
    if (!isResizing())
        return;
    bool is_control = e->modifiers() & Qt::ControlModifier;
    int delta = is_control?1:8;
    QPoint pos = QCursor::pos();
    switch (e->key()) {
    case Qt::Key_Left:
        pos.rx() -= delta;
        if (pos.x() <= QGuiApplication::primaryScreen()->virtualGeometry().left()) {
            if (mode == TopLeft || mode == BottomLeft) {
                moveOffset.rx() += delta;
                invertedMoveOffset.rx() += delta;
            } else {
                moveOffset.rx() -= delta;
                invertedMoveOffset.rx() -= delta;
            }
        }
        if (isResizing() && !resizeHorizontalDirectionFixed) {
            resizeHorizontalDirectionFixed = true;
            if (mode == BottomRight)
                mode = BottomLeft;
            else if (mode == TopRight)
                mode = TopLeft;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Right:
        pos.rx() += delta;
        if (pos.x() >= QGuiApplication::primaryScreen()->virtualGeometry().right()) {
            if (mode == TopRight || mode == BottomRight) {
                moveOffset.rx() += delta;
                invertedMoveOffset.rx() += delta;
            } else {
                moveOffset.rx() -= delta;
                invertedMoveOffset.rx() -= delta;
            }
        }
        if (isResizing() && !resizeHorizontalDirectionFixed) {
            resizeHorizontalDirectionFixed = true;
            if (mode == BottomLeft)
                mode = BottomRight;
            else if (mode == TopLeft)
                mode = TopRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Up:
        pos.ry() -= delta;
        if (pos.y() <= QGuiApplication::primaryScreen()->virtualGeometry().top()) {
            if (mode == TopLeft || mode == TopRight) {
                moveOffset.ry() += delta;
                invertedMoveOffset.ry() += delta;
            } else {
                moveOffset.ry() -= delta;
                invertedMoveOffset.ry() -= delta;
            }
        }
        if (isResizing() && !resizeVerticalDirectionFixed) {
            resizeVerticalDirectionFixed = true;
            if (mode == BottomLeft)
                mode = TopLeft;
            else if (mode == BottomRight)
                mode = TopRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Down:
        pos.ry() += delta;
        if (pos.y() >= QGuiApplication::primaryScreen()->virtualGeometry().bottom()) {
            if (mode == BottomLeft || mode == BottomRight) {
                moveOffset.ry() += delta;
                invertedMoveOffset.ry() += delta;
            } else {
                moveOffset.ry() -= delta;
                invertedMoveOffset.ry() -= delta;
            }
        }
        if (isResizing() && !resizeVerticalDirectionFixed) {
            resizeVerticalDirectionFixed = true;
            if (mode == TopLeft)
                mode = BottomLeft;
            else if (mode == TopRight)
                mode = BottomRight;
#ifndef QT_NO_CURSOR
            setMouseCursor(mode);
            widget->grabMouse(widget->cursor());
#else
            widget->grabMouse();
#endif
        }
        break;
    case Qt::Key_Space:
    case Qt::Key_Return:
    case Qt::Key_Enter:
    case Qt::Key_Escape:
        active = false;
        widget->releaseMouse();
        widget->releaseKeyboard();
        buttonDown = false;
        break;
    default:
        return;
    }
    QCursor::setPos(pos);
}